

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall HighsSparseMatrix::exactResize(HighsSparseMatrix *this)

{
  pointer piVar1;
  int iVar2;
  
  std::vector<int,_std::allocator<int>_>::resize
            (&this->start_,(long)((&this->num_col_)[this->format_ != kColwise] + 1));
  piVar1 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->format_ == kColwise) {
    iVar2 = piVar1[this->num_col_];
  }
  else {
    iVar2 = piVar1[this->num_row_];
    if (this->format_ == kRowwisePartitioned) {
      std::vector<int,_std::allocator<int>_>::resize(&this->p_end_,(long)this->num_row_);
      goto LAB_00360162;
    }
  }
  piVar1 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
LAB_00360162:
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,(long)iVar2);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar2);
  return;
}

Assistant:

void HighsSparseMatrix::exactResize() {
  if (this->isColwise()) {
    this->start_.resize(this->num_col_ + 1);
  } else {
    this->start_.resize(this->num_row_ + 1);
  }
  const HighsInt num_nz = this->isColwise() ? this->start_[this->num_col_]
                                            : this->start_[this->num_row_];
  if (this->format_ == MatrixFormat::kRowwisePartitioned) {
    this->p_end_.resize(this->num_row_);
  } else {
    assert((int)this->p_end_.size() == 0);
    this->p_end_.clear();
  }
  this->index_.resize(num_nz);
  this->value_.resize(num_nz);
}